

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O2

Vec_Ptr_t * Psr_ManReadBlif(char *pFileName)

{
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  undefined1 *puVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  char *pcVar7;
  Psr_Man_t *p_01;
  Abc_Nam_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  byte *pbVar11;
  Psr_Ntk_t *pPVar12;
  byte bVar13;
  uint uVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  undefined8 extraout_RDX;
  undefined8 uVar15;
  undefined8 extraout_RDX_00;
  long lVar16;
  ulong uVar17;
  Vec_Int_t *vVec1;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open input file.");
    return (Vec_Ptr_t *)0x0;
  }
  fseek(__stream,0,2);
  lVar6 = ftell(__stream);
  rewind(__stream);
  lVar16 = lVar6 << 0x20;
  pcVar7 = (char *)malloc(lVar16 + 0x1000000000 >> 0x20);
  *pcVar7 = '\n';
  fread(pcVar7 + 1,(long)(int)lVar6,1,__stream);
  fclose(__stream);
  pcVar7[lVar16 + 0x100000000 >> 0x20] = '\n';
  pcVar7[lVar16 + 0x200000000 >> 0x20] = '\0';
  p_01 = (Psr_Man_t *)calloc(1,0x488);
  p_01->pName = pFileName;
  p_01->pBuffer = pcVar7;
  p_01->pLimit = pcVar7 + (long)(int)lVar6 + 3;
  p_01->pCur = pcVar7;
  pAVar8 = Abc_NamStart(1000,0x18);
  p_01->pStrs = pAVar8;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  p_01->vNtks = pVVar9;
  for (lVar6 = 1; lVar6 != 0xb; lVar6 = lVar6 + 1) {
    Abc_NamStrFindOrAdd(p_01->pStrs,s_BlifTypes[lVar6],(int *)0x0);
  }
  iVar4 = Abc_NamObjNumMax(p_01->pStrs);
  if (iVar4 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                  ,0x42,"void Psr_NtkAddBlifDirectives(Psr_Man_t *)");
  }
  p = &p_01->vCover;
  p_00 = &p_01->vTemp;
LAB_003220be:
  do {
    while( true ) {
      pcVar7 = p_01->pCur;
      if (pcVar7[1] == '\0') goto LAB_003228d4;
      if (*pcVar7 != '\n') {
        __assert_fail("Psr_ManIsChar(p, \'\\n\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                      ,0x180,"int Psr_ManReadLines(Psr_Man_t *)");
      }
      p_01->pCur = pcVar7 + 1;
      Psr_ManSkipSpaces(p_01);
      pbVar11 = (byte *)p_01->pCur;
      bVar13 = *pbVar11;
      if (1 < bVar13 - 0x30) break;
LAB_00322126:
      while ((bVar13 < 0x32 && ((0x3200000000000U >> ((ulong)bVar13 & 0x3f) & 1) != 0))) {
        p_01->pCur = (char *)(pbVar11 + 1);
        Vec_StrPush(p,*pbVar11);
        pbVar11 = (byte *)p_01->pCur;
        bVar13 = *pbVar11;
      }
      Psr_ManSkipSpaces(p_01);
      bVar13 = *p_01->pCur;
      if ((bVar13 - 0x30 < 2) || (bVar13 == 0x2d)) {
        Vec_StrPush(p,' ');
        pcVar7 = p_01->pCur;
        p_01->pCur = pcVar7 + 1;
        Vec_StrPush(p,*pcVar7);
        Vec_StrPush(p,'\n');
        Psr_ManSkipSpaces(p_01);
        if (*p_01->pCur != '\n') {
          pcVar7 = "Cannot read end of cube.";
          iVar4 = extraout_EDX_00;
          goto LAB_003228cc;
        }
      }
      else {
        iVar4 = extraout_EDX;
        if (bVar13 != 10) {
          pcVar7 = "Cannot read output literal.";
          goto LAB_003228cc;
        }
        if ((p_01->vCover).nSize != 1) {
          pcVar7 = "Cannot read cube.";
          goto LAB_003228cc;
        }
        Vec_StrPush(p,*(p_01->vCover).pArray);
        if ((p_01->vCover).nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        *(p_01->vCover).pArray = ' ';
        Vec_StrPush(p,'\n');
      }
    }
  } while (bVar13 == 10);
  if (bVar13 != 0x2e) {
    if (bVar13 != 0x2d) {
      __assert_fail("Psr_ManIsLit(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                    ,0xc9,"int Psr_ManReadCube(Psr_Man_t *)");
    }
    goto LAB_00322126;
  }
  iVar4 = (p_01->vCover).nSize;
  if (0 < iVar4) {
    if (iVar4 == 2) {
      cVar3 = Vec_StrEntryLast(p);
      bVar13 = 4;
      if (cVar3 != '0') {
        cVar3 = Vec_StrEntryLast(p);
        bVar13 = 8;
        if (cVar3 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                        ,0xe9,"void Psr_ManSaveCover(Psr_Man_t *)");
        }
      }
      puVar1 = &p_01->pNtk->field_0x4;
      *puVar1 = *puVar1 | bVar13;
      if ((p_01->vCover).nSize < 1) {
        __assert_fail("Vec_StrSize(&p->vCover) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                      ,0xeb,"void Psr_ManSaveCover(Psr_Man_t *)");
      }
    }
    Vec_StrPush(p,'\0');
    pcVar7 = (p_01->vCover).pArray;
    iVar5 = strcmp(pcVar7," 0\n");
    iVar4 = 6;
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar7," 1\n");
      iVar4 = 7;
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar7,"1 1\n");
        iVar4 = 10;
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar7,"0 1\n");
          iVar4 = 0xb;
          if (iVar5 != 0) {
            iVar5 = strcmp(pcVar7,"11 1\n");
            iVar4 = 0xc;
            if (iVar5 != 0) {
              iVar5 = strcmp(pcVar7,"00 1\n");
              iVar4 = 0xf;
              if (iVar5 != 0) {
                iVar5 = strcmp(pcVar7,"00 0\n");
                iVar4 = 0xe;
                if (iVar5 != 0) {
                  iVar5 = strcmp(pcVar7,"-1 1\n1- 1\n");
                  iVar4 = 0xe;
                  if (iVar5 != 0) {
                    iVar5 = strcmp(pcVar7,"1- 1\n-1 1\n");
                    iVar4 = 0xe;
                    if (iVar5 != 0) {
                      iVar5 = strcmp(pcVar7,"01 1\n10 1\n");
                      iVar4 = 0x10;
                      if (iVar5 != 0) {
                        iVar5 = strcmp(pcVar7,"10 1\n01 1\n");
                        iVar4 = 0x10;
                        if (iVar5 != 0) {
                          iVar5 = strcmp(pcVar7,"11 1\n00 1\n");
                          iVar4 = 0x11;
                          if (iVar5 != 0) {
                            iVar5 = strcmp(pcVar7,"00 1\n11 1\n");
                            iVar4 = 0x11;
                            if (iVar5 != 0) {
                              iVar5 = strcmp(pcVar7,"10 1\n");
                              iVar4 = 0x12;
                              if (iVar5 != 0) {
                                iVar5 = strcmp(pcVar7,"01 1\n");
                                iVar4 = 0x13;
                                if (iVar5 != 0) {
                                  __assert_fail("0",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                                ,0x382,"Bac_ObjType_t Ptr_SopToType(char *)");
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    (p_01->vCover).nSize = 0;
    pPVar12 = p_01->pNtk;
    iVar5 = Vec_IntEntry(&pPVar12->vObjs,(pPVar12->vObjs).nSize + -1);
    iVar5 = Vec_IntEntry(&pPVar12->vBoxes,iVar5 + 1);
    if (iVar5 != 1) {
      __assert_fail("Psr_BoxNtk(p->pNtk, Psr_NtkBoxNum(p->pNtk)-1) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                    ,0xf1,"void Psr_ManSaveCover(Psr_Man_t *)");
    }
    pPVar12 = p_01->pNtk;
    iVar5 = Vec_IntEntry(&pPVar12->vObjs,(pPVar12->vObjs).nSize + -1);
    Vec_IntWriteEntry(&pPVar12->vBoxes,iVar5 + 1,iVar4);
  }
  iVar5 = Psr_ManReadName(p_01);
  iVar4 = 0x7a309c;
  switch(iVar5) {
  case 1:
    if (p_01->pNtk != (Psr_Ntk_t *)0x0) {
      pcVar7 = "Parsing previous model is unfinished.";
      goto LAB_003228cc;
    }
    iVar5 = Psr_ManReadName(p_01);
    iVar4 = extraout_EDX_01;
    if (iVar5 == 0) goto LAB_00322844;
    if (p_01->pNtk != (Psr_Ntk_t *)0x0) {
      __assert_fail("p->pNtk == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                    ,0xb4,"void Psr_ManInitializeNtk(Psr_Man_t *, int, int)");
    }
    pPVar12 = (Psr_Ntk_t *)calloc(1,0xe0);
    p_01->pNtk = pPVar12;
    pPVar12->iModuleName = iVar5;
    pAVar8 = Abc_NamRef(p_01->pStrs);
    pPVar12 = p_01->pNtk;
    pPVar12->pStrs = pAVar8;
    pVVar9 = p_01->vNtks;
    iVar4 = pVVar9->nSize;
    if (iVar4 == pVVar9->nCap) {
      uVar14 = iVar4 * 2;
      if (iVar4 < 0x10) {
        uVar14 = 0x10;
      }
      if (iVar4 < (int)uVar14) {
        if (pVVar9->pArray == (void **)0x0) {
          ppvVar10 = (void **)malloc((ulong)uVar14 << 3);
        }
        else {
          ppvVar10 = (void **)realloc(pVVar9->pArray,(ulong)uVar14 << 3);
          iVar4 = pVVar9->nSize;
        }
        pVVar9->pArray = ppvVar10;
        pVVar9->nCap = uVar14;
      }
    }
    pVVar9->nSize = iVar4 + 1;
    pVVar9->pArray[iVar4] = pPVar12;
    Psr_ManSkipSpaces(p_01);
    if (*p_01->pCur != '\n') {
      pcVar7 = "Trailing symbols on .model line.";
      iVar4 = extraout_EDX_12;
      goto LAB_003228cc;
    }
    goto LAB_003220be;
  case 2:
    iVar4 = Psr_ManReadList(p_01,&p_01->pNtk->vOrder,3);
    if (iVar4 != 0) goto LAB_003228d4;
    vVec1 = &p_01->pNtk->vInouts;
    break;
  case 3:
    iVar4 = Psr_ManReadList(p_01,&p_01->pNtk->vOrder,1);
    if (iVar4 != 0) goto LAB_003228d4;
    vVec1 = &p_01->pNtk->vInputs;
    break;
  case 4:
    iVar4 = Psr_ManReadList(p_01,&p_01->pNtk->vOrder,2);
    if (iVar4 != 0) goto LAB_003228d4;
    vVec1 = &p_01->pNtk->vOutputs;
    break;
  case 5:
    (p_01->vTemp).nSize = 0;
    while (iVar4 = Psr_ManReadName(p_01), iVar4 != 0) {
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,iVar4);
    }
    if ((p_01->vTemp).nSize == 0) {
      pcVar7 = "Signal list is empty.";
      iVar4 = extraout_EDX_02;
      goto LAB_003228cc;
    }
    Psr_NtkAddBox(p_01->pNtk,1,0,p_00);
    goto LAB_003220be;
  case 6:
    bVar2 = true;
    goto LAB_00322658;
  case 7:
    bVar2 = false;
LAB_00322658:
    iVar5 = Psr_ManReadName(p_01);
    iVar4 = (int)extraout_RDX;
    if (iVar5 == 0) {
LAB_00322844:
      pcVar7 = "Cannot read model name.";
      goto LAB_003228cc;
    }
    (p_01->vTemp).nSize = 0;
    uVar15 = extraout_RDX;
    while (iVar4 = (int)uVar15, *p_01->pCur != '\n') {
      iVar4 = Psr_ManReadName(p_01);
      if (iVar4 == 0) {
        pcVar7 = "Cannot read formal name.";
        iVar4 = extraout_EDX_06;
        goto LAB_003228cc;
      }
      Vec_IntPush(p_00,iVar4);
      Psr_ManSkipSpaces(p_01);
      pcVar7 = p_01->pCur;
      p_01->pCur = pcVar7 + 1;
      if (*pcVar7 != '=') {
        pcVar7 = "Cannot find symbol \"=\".";
        iVar4 = extraout_EDX_07;
        goto LAB_003228cc;
      }
      iVar4 = Psr_ManReadName(p_01);
      if (iVar4 == 0) {
        pcVar7 = "Cannot read actual name.";
        iVar4 = extraout_EDX_08;
        goto LAB_003228cc;
      }
      Vec_IntPush(p_00,iVar4);
      Psr_ManSkipSpaces(p_01);
      uVar15 = extraout_RDX_00;
    }
    uVar14 = (p_01->vTemp).nSize;
    if (uVar14 == 0) {
      pcVar7 = "Cannot read a list of formal/actual names.";
      goto LAB_003228cc;
    }
    if ((uVar14 & 1) != 0) {
      pcVar7 = "The number of formal/actual names is not even.";
      goto LAB_003228cc;
    }
    Psr_NtkAddBox(p_01->pNtk,iVar5,0,p_00);
    if (!bVar2) {
      puVar1 = &p_01->pNtk->field_0x4;
      *puVar1 = *puVar1 | 1;
    }
    goto LAB_003220be;
  case 8:
    iVar4 = Psr_ManReadName(p_01);
    (p_01->vTemp).nSize = 0;
    if (iVar4 == 0) {
      pcVar7 = "Cannot read latch input.";
      iVar4 = extraout_EDX_04;
    }
    else {
      Vec_IntWriteEntry(p_00,1,iVar4);
      iVar4 = Psr_ManReadName(p_01);
      if (iVar4 != 0) {
        cVar3 = '\0';
        Vec_IntWriteEntry(p_00,0,iVar4);
        Psr_ManSkipSpaces(p_01);
        iVar5 = (*p_01->pCur != '1') + 1;
        if (*p_01->pCur == '0') {
          iVar5 = 0;
        }
        Psr_ManSkipToChar(p_01,cVar3);
        pPVar12 = p_01->pNtk;
        iVar4 = -1;
        goto LAB_00322743;
      }
      pcVar7 = "Cannot read latch output.";
      iVar4 = extraout_EDX_05;
    }
    goto LAB_003228cc;
  case 9:
    iVar4 = Psr_ManReadName(p_01);
    (p_01->vTemp).nSize = 0;
    if (iVar4 == 0) {
      pcVar7 = "Cannot read .short input.";
      iVar4 = extraout_EDX_09;
      goto LAB_003228cc;
    }
    Vec_IntWriteEntry(p_00,1,iVar4);
    iVar4 = Psr_ManReadName(p_01);
    if (iVar4 == 0) {
      pcVar7 = "Cannot read .short output.";
      iVar4 = extraout_EDX_10;
      goto LAB_003228cc;
    }
    Vec_IntWriteEntry(p_00,0,iVar4);
    Psr_ManSkipSpaces(p_01);
    if (*p_01->pCur != '\n') {
      pcVar7 = "Trailing symbols on .short line.";
      iVar4 = extraout_EDX_11;
      goto LAB_003228cc;
    }
    iVar4 = Abc_NamStrFindOrAdd(p_01->pStrs,"1 1\n",(int *)0x0);
    pPVar12 = p_01->pNtk;
    iVar5 = 0;
LAB_00322743:
    Psr_NtkAddBox(pPVar12,iVar4,iVar5,p_00);
    goto LAB_003220be;
  case 10:
    if (p_01->pNtk != (Psr_Ntk_t *)0x0) goto code_r0x00322534;
    pcVar7 = "Directive .end without .model.";
    goto LAB_003228cc;
  default:
    pcVar7 = Abc_NamStr(p_01->pStrs,iVar5);
    printf("Cannot read directive \"%s\".\n",pcVar7);
    goto LAB_003228d4;
  }
  Vec_IntAppend(vVec1,p_00);
  goto LAB_003220be;
code_r0x00322534:
  p_01->pNtk = (Psr_Ntk_t *)0x0;
  Psr_ManSkipSpaces(p_01);
  if (*p_01->pCur != '\n') {
    pcVar7 = "Trailing symbols on .end line.";
    iVar4 = extraout_EDX_03;
LAB_003228cc:
    Psr_ManErrorSet(p_01,pcVar7,iVar4);
LAB_003228d4:
    if (p_01->ErrorStr[0] == '\0') {
      pVVar9 = p_01->vNtks;
      p_01->vNtks = (Vec_Ptr_t *)0x0;
    }
    else {
      uVar17 = 0;
      for (pcVar7 = p_01->pBuffer; pcVar7 < p_01->pCur; pcVar7 = pcVar7 + 1) {
        uVar17 = (ulong)((int)uVar17 + (uint)(*pcVar7 == '\n'));
      }
      pVVar9 = (Vec_Ptr_t *)0x0;
      printf("Line %d: %s\n",uVar17,p_01->ErrorStr);
    }
    if (p_01->pStrs != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(p_01->pStrs);
    }
    if (p_01->vNtks != (Vec_Ptr_t *)0x0) {
      Psr_ManVecFree(p_01->vNtks);
    }
    pcVar7 = (p_01->vCover).pArray;
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
      (p_01->vCover).pArray = (char *)0x0;
    }
    (p_01->vCover).nCap = 0;
    (p_01->vCover).nSize = 0;
    Vec_IntErase(p_00);
    Vec_IntErase(&p_01->vTemp2);
    Vec_IntErase(&p_01->vKnown);
    Vec_IntErase(&p_01->vFailed);
    Vec_IntErase(&p_01->vSucceeded);
    free(p_01->pBuffer);
    free(p_01);
    return pVVar9;
  }
  goto LAB_003220be;
}

Assistant:

Vec_Ptr_t * Psr_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Psr_Man_t * p = Psr_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Psr_NtkAddBlifDirectives( p );
    Psr_ManReadLines( p );
    if ( Psr_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Psr_ManFree( p );
    return vPrs;
}